

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiInputTextState::ImGuiInputTextState(ImGuiInputTextState *this)

{
  void *in_RDI;
  
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)((long)in_RDI + 8));
  ImVector<char>::ImVector((ImVector<char> *)((long)in_RDI + 0x18));
  ImVector<char>::ImVector((ImVector<char> *)((long)in_RDI + 0x28));
  memset(in_RDI,0,0xe88);
  return;
}

Assistant:

ImGuiInputTextState()                           { memset(this, 0, sizeof(*this)); }